

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

iterator __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::priv::(anonymous_namespace)::BadFastHash,_std::equal_to<int>,_std::allocator<int>_>
::find<long>(raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::priv::(anonymous_namespace)::BadFastHash,_std::equal_to<int>,_std::allocator<int>_>
             *this,key_arg<long> *key)

{
  char *pcVar1;
  ctrl_t *pcVar2;
  ulong uVar3;
  uint uVar4;
  ushort uVar5;
  char cVar6;
  anon_union_8_1_a8a14541_for_iterator_1 in_RDX;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  __m128i match;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  iterator iVar12;
  
  pcVar2 = this->ctrl_;
  uVar3 = this->capacity_;
  uVar7 = uVar3;
  if (pcVar2 != (ctrl_t *)0x0) {
    if ((uVar3 + 1 & uVar3) != 0) {
      __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
    }
    uVar7 = (ulong)pcVar2 >> 0xc;
    lVar8 = 0;
    while( true ) {
      in_RDX.slot_ = (slot_type *)(uVar7 & uVar3);
      pcVar1 = pcVar2 + (long)in_RDX.slot_;
      cVar6 = pcVar1[0xf];
      auVar11[0] = -(*pcVar1 == '\0');
      auVar11[1] = -(pcVar1[1] == '\0');
      auVar11[2] = -(pcVar1[2] == '\0');
      auVar11[3] = -(pcVar1[3] == '\0');
      auVar11[4] = -(pcVar1[4] == '\0');
      auVar11[5] = -(pcVar1[5] == '\0');
      auVar11[6] = -(pcVar1[6] == '\0');
      auVar11[7] = -(pcVar1[7] == '\0');
      auVar11[8] = -(pcVar1[8] == '\0');
      auVar11[9] = -(pcVar1[9] == '\0');
      auVar11[10] = -(pcVar1[10] == '\0');
      auVar11[0xb] = -(pcVar1[0xb] == '\0');
      auVar11[0xc] = -(pcVar1[0xc] == '\0');
      auVar11[0xd] = -(pcVar1[0xd] == '\0');
      auVar11[0xe] = -(pcVar1[0xe] == '\0');
      auVar11[0xf] = -(cVar6 == '\0');
      uVar5 = (ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe | (ushort)(auVar11[0xf] >> 7) << 0xf;
      if (uVar5 != 0) {
        uVar9 = (uint)uVar5;
        do {
          uVar4 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
            }
          }
          uVar7 = (ulong)uVar4 + (long)in_RDX.slot_ & uVar3;
          if ((int)this->slots_[uVar7] == (int)key) {
            in_RDX.slot_ = this->slots_ + uVar7;
            goto LAB_0011ff89;
          }
          uVar9 = uVar9 - 1 & uVar9;
        } while (uVar9 != 0);
      }
      auVar10[0] = -(*pcVar1 == -0x80);
      auVar10[1] = -(pcVar1[1] == -0x80);
      auVar10[2] = -(pcVar1[2] == -0x80);
      auVar10[3] = -(pcVar1[3] == -0x80);
      auVar10[4] = -(pcVar1[4] == -0x80);
      auVar10[5] = -(pcVar1[5] == -0x80);
      auVar10[6] = -(pcVar1[6] == -0x80);
      auVar10[7] = -(pcVar1[7] == -0x80);
      auVar10[8] = -(pcVar1[8] == -0x80);
      auVar10[9] = -(pcVar1[9] == -0x80);
      auVar10[10] = -(pcVar1[10] == -0x80);
      auVar10[0xb] = -(pcVar1[0xb] == -0x80);
      auVar10[0xc] = -(pcVar1[0xc] == -0x80);
      auVar10[0xd] = -(pcVar1[0xd] == -0x80);
      auVar10[0xe] = -(pcVar1[0xe] == -0x80);
      auVar10[0xf] = -(cVar6 == -0x80);
      uVar7 = uVar3;
      if ((((((((((((((((auVar10 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar10 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar10 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar10 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar10 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar10 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar10 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar10 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar10 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar10 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar10 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar10 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar10 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar10 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar10 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar6 == -0x80)
      break;
      uVar7 = (long)in_RDX.slot_ + lVar8 + 0x10;
      lVar8 = lVar8 + 0x10;
    }
  }
LAB_0011ff89:
  iVar12.ctrl_ = pcVar2 + uVar7;
  iVar12.field_1.slot_ = in_RDX.slot_;
  return iVar12;
}

Assistant:

iterator find(const key_arg<K>& key) {
        return find(key, this->hash(key));
    }